

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_local(LexState *ls)

{
  int iVar1;
  BCReg nvars_00;
  GCstr *pGVar2;
  BCReg local_78;
  BCReg local_74;
  BCReg nvars;
  BCReg nexps;
  ExpDesc e;
  FuncState *fs;
  ExpDesc b;
  ExpDesc v;
  LexState *ls_local;
  
  iVar1 = lex_opt(ls,0x109);
  if (iVar1 == 0) {
    local_78 = 0;
    do {
      nvars_00 = local_78 + 1;
      pGVar2 = lex_str(ls);
      var_new(ls,local_78,pGVar2);
      iVar1 = lex_opt(ls,0x2c);
      local_78 = nvars_00;
    } while (iVar1 != 0);
    iVar1 = lex_opt(ls,0x3d);
    if (iVar1 == 0) {
      e.u.s.info = 0xe;
      local_74 = 0;
    }
    else {
      local_74 = expr_list(ls,(ExpDesc *)&nvars);
    }
    assign_adjust(ls,nvars_00,local_74,(ExpDesc *)&nvars);
    var_add(ls,nvars_00);
  }
  else {
    e._16_8_ = ls->fs;
    pGVar2 = lex_str(ls);
    var_new(ls,0,pGVar2);
    b.f = *(BCPos *)(e._16_8_ + 0x34);
    b._20_4_ = ZEXT24(*(ushort *)(e._16_8_ + 0x5c + (ulong)*(uint *)(e._16_8_ + 0x34) * 2));
    bcreg_reserve((FuncState *)e._16_8_,1);
    var_add(ls,1);
    parse_body(ls,(ExpDesc *)&fs,0,ls->linenumber);
    expr_free((FuncState *)e._16_8_,(ExpDesc *)&fs);
    expr_toreg((FuncState *)e._16_8_,(ExpDesc *)&fs,b.f);
    ls->vstack[*(ushort *)(e._16_8_ + 0x5c + (ulong)(*(int *)(e._16_8_ + 0x38) - 1) * 2)].startpc =
         *(BCPos *)(e._16_8_ + 0x28);
  }
  return;
}

Assistant:

static void parse_local(LexState *ls)
{
  if (lex_opt(ls, TK_function)) {  /* Local function declaration. */
    ExpDesc v, b;
    FuncState *fs = ls->fs;
    var_new(ls, 0, lex_str(ls));
    expr_init(&v, VLOCAL, fs->freereg);
    v.u.s.aux = fs->varmap[fs->freereg];
    bcreg_reserve(fs, 1);
    var_add(ls, 1);
    parse_body(ls, &b, 0, ls->linenumber);
    /* bcemit_store(fs, &v, &b) without setting VSTACK_VAR_RW. */
    expr_free(fs, &b);
    expr_toreg(fs, &b, v.u.s.info);
    /* The upvalue is in scope, but the local is only valid after the store. */
    var_get(ls, fs, fs->nactvar - 1).startpc = fs->pc;
  } else {  /* Local variable declaration. */
    ExpDesc e;
    BCReg nexps, nvars = 0;
    do {  /* Collect LHS. */
      var_new(ls, nvars++, lex_str(ls));
    } while (lex_opt(ls, ','));
    if (lex_opt(ls, '=')) {  /* Optional RHS. */
      nexps = expr_list(ls, &e);
    } else {  /* Or implicitly set to nil. */
      e.k = VVOID;
      nexps = 0;
    }
    assign_adjust(ls, nvars, nexps, &e);
    var_add(ls, nvars);
  }
}